

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_RecursiveDependencyTest_Test::TestBody
          (TestSuite_RecursiveDependencyTest_Test *this)

{
  long lVar1;
  unique_ptr<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  this_00;
  Configuration default_conf;
  allocator local_c9;
  string local_c8 [32];
  Configuration local_a8;
  
  Configuration::Configuration(&local_a8);
  local_a8.testing_mode = true;
  local_a8.verbose = false;
  this_00._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )operator_new(0x180);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)
             this_00._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  std::__cxx11::string::string
            (local_c8,
             "CREATE TABLE Comments (comment_id   SERIAL PRIMARY KEY,parent_id    BIGINT UNSIGNED,FOREIGN KEY (parent_id) REFERENCES Comments(comment_id));\n"
             ,&local_c9);
  std::__cxx11::stringbuf::str
            ((string *)
             ((long)this_00._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10));
  std::__cxx11::string::~string(local_c8);
  if ((__uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_a8.test_stream._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    lVar1 = *(long *)local_a8.test_stream._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
    local_a8.test_stream._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         this_00._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    (**(code **)(lVar1 + 8))();
    this_00._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_a8.test_stream;
  }
  local_a8.test_stream._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this_00;
  Check(&local_a8);
  Configuration::~Configuration(&local_a8);
  return;
}

Assistant:

TEST(TestSuite, RecursiveDependencyTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE Comments ("
      "comment_id   SERIAL PRIMARY KEY,"
      "parent_id    BIGINT UNSIGNED,"
      "FOREIGN KEY (parent_id) REFERENCES Comments(comment_id));\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}